

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_non_terminals.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
::begin_object(object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
               *this)

{
  error_code eVar1;
  tuple<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>_*>
  local_80;
  __type local_78;
  code *local_30;
  undefined8 local_28;
  object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
  *local_20;
  object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
  *this_local;
  error_category *local_10;
  
  local_30 = rule::
             replace_top<pstore::exchange::import_ns::compilation,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>
  ;
  local_28 = 0;
  local_20 = this;
  std::
  make_tuple<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>*>
            ((object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
              **)&local_80);
  std::
  tuple_cat<std::tuple<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>*>,std::tuple<pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>&,void>
            (&local_78,&local_80,&this->args_);
  cxx17shim::
  apply<std::error_code(pstore::exchange::import_ns::rule::*)(pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128),std::tuple<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>*,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::uint128>>
            ((offset_in_rule_to_subr *)&local_30,&local_78);
  std::
  tuple<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>_*,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_pstore::uint128>
  ::~tuple(&local_78);
  std::error_code::error_code((error_code *)&this_local);
  eVar1._4_4_ = 0;
  eVar1._M_value = (uint)this_local;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code begin_object () override {
                    cxx17shim::apply (&object_rule::replace_top<NextState, Args...>,
                                      std::tuple_cat (std::make_tuple (this), args_));
                    return {};
                }